

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Underwater_Acoustic_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Underwater_Acoustic_PDU::SetAPA
          (Underwater_Acoustic_PDU *this,
          vector<KDIS::DATA_TYPE::APA,_std::allocator<KDIS::DATA_TYPE::APA>_> *A)

{
  size_type sVar1;
  vector<KDIS::DATA_TYPE::APA,_std::allocator<KDIS::DATA_TYPE::APA>_> *A_local;
  Underwater_Acoustic_PDU *this_local;
  
  sVar1 = std::vector<KDIS::DATA_TYPE::APA,_std::allocator<KDIS::DATA_TYPE::APA>_>::size
                    (&this->m_vAPA);
  (this->super_Header).super_Header6.m_ui16PDULength =
       (this->super_Header).super_Header6.m_ui16PDULength - (short)(sVar1 << 2);
  std::vector<KDIS::DATA_TYPE::APA,_std::allocator<KDIS::DATA_TYPE::APA>_>::operator=
            (&this->m_vAPA,A);
  sVar1 = std::vector<KDIS::DATA_TYPE::APA,_std::allocator<KDIS::DATA_TYPE::APA>_>::size
                    (&this->m_vAPA);
  (this->super_Header).super_Header6.m_ui16PDULength =
       (this->super_Header).super_Header6.m_ui16PDULength + (short)(sVar1 << 2);
  sVar1 = std::vector<KDIS::DATA_TYPE::APA,_std::allocator<KDIS::DATA_TYPE::APA>_>::size
                    (&this->m_vAPA);
  this->m_ui8NumAPA = (KUINT8)sVar1;
  return;
}

Assistant:

void Underwater_Acoustic_PDU::SetAPA( const vector<APA> & A )
{
    // Reset PDU length
    m_ui16PDULength -= m_vAPA.size() * APA::APA_SIZE;

    m_vAPA= A;

    // Calculate the new PDU length
    m_ui16PDULength += m_vAPA.size() * APA::APA_SIZE;

    m_ui8NumAPA = m_vAPA.size();
}